

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

Expression * __thiscall
soul::heart::Parser::checkExpressionType
          (Parser *this,Expression *r,Type *requiredType,CodeLocation *errorPos)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  Value constValue;
  string sStack_c8;
  pool_ptr<const_soul::Module> local_a8;
  Value local_a0;
  CompileMessage local_60;
  
  (*(r->super_Object)._vptr_Object[7])(&local_a0);
  if (local_a0.type.category != invalid) {
    bVar1 = TypeRules::canSilentlyCastTo(requiredType,&local_a0);
    if (bVar1) goto LAB_0024aa5f;
  }
  iVar2 = (*(r->super_Object)._vptr_Object[2])(r);
  bVar1 = TypeRules::canPassAsArgumentTo(requiredType,(Type *)CONCAT44(extraout_var,iVar2),true);
  if (!bVar1) {
    local_a8.object = (this->module).object;
    Program::ProgramImpl::getTypeDescriptionWithQualificationIfNeeded_abi_cxx11_
              (&sStack_c8,(this->program).pimpl,&local_a8,requiredType);
    CompileMessageHelpers::createMessage<std::__cxx11::string>
              (&local_60,(CompileMessageHelpers *)0x1,none,0x2a2f0d,(char *)&sStack_c8,in_R9);
    CodeLocation::throwError(errorPos,&local_60);
  }
LAB_0024aa5f:
  soul::Value::~Value(&local_a0);
  return r;
}

Assistant:

heart::Expression& checkExpressionType (heart::Expression& r, const Type& requiredType, const CodeLocation& errorPos)
    {
        auto constValue = r.getAsConstant();

        if (constValue.isValid() && TypeRules::canSilentlyCastTo (requiredType, constValue))
            return r;

        if (! TypeRules::canPassAsArgumentTo (requiredType, r.getType(), true))
            errorPos.throwError (Errors::expectedExpressionOfType (getTypeDescription (requiredType)));

        return r;
    }